

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

uint32_t simd::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                  SIMDType simdType)

{
  uint32_t y_00;
  uint in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  SIMDType in_R9D;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  uint32_t simdSize;
  uint32_t in_stack_00000054;
  uint32_t in_stack_000000d4;
  uint32_t in_stack_000000d8;
  uint32_t in_stack_000000dc;
  uint8_t *in_stack_000000e0;
  uint8_t *in_stack_000000e8;
  uint32_t in_stack_000000f4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  SIMDType in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  y_00 = getSimdSize(in_R9D);
  if ((in_R9D == cpu_function) || (in_ECX < y_00)) {
    if (in_R9D == avx_function) {
      local_4 = Sum((Image *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,0,y_00,in_stack_ffffffffffffffd4)
      ;
    }
    else {
      local_4 = Image_Function::Sum((Image *)CONCAT44(in_ECX,in_R8D),in_R9D,y_00,
                                    in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    }
  }
  else {
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffc8,
               (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffc0);
    Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffffc0);
    Image_Function::OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((uint32_t *)in_stack_ffffffffffffffc0,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    if (in_R9D == avx_function) {
      local_4 = avx::Sum(in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,
                         in_stack_000000d8,in_stack_000000d4);
    }
    else if (in_R9D == sse_function) {
      local_4 = sse::Sum(in_stack_00000054,(uint8_t *)image,(uint8_t *)CONCAT44(x,y),width,height,
                         simdType);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            #ifdef PENGUINV_AVX_SET
            if ( simdType == avx_function )
                return Sum( image, x, y, width, height, sse_function );
            #endif

            return Image_Function::Sum( image, x, y, width, height );
        }

        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        #ifdef PENGUINV_AVX_SET
        if ( simdType == avx_function )
            return avx::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_SSE_SET
        if ( simdType == sse_function )
            return sse::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif
        #ifdef PENGUINV_NEON_SET
        if (simdType == neon_function)
            return neon::Sum( rowSize, imageY, imageYEnd, simdWidth, totalSimdWidth, nonSimdWidth );
        #endif

        return 0u;
    }